

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O0

vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> * __thiscall
fasttext::Meter::precisionRecallCurve(Meter *this,int32_t labelId)

{
  unsigned_long uVar1;
  bool bVar2;
  mapped_type *pmVar3;
  pointer ppVar4;
  int in_EDX;
  uint64_t *in_RSI;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *in_RDI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double recall;
  double falsePositives;
  double truePositives;
  double precision;
  const_iterator it;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  fullRecall;
  uint64_t golds;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *positiveCounts;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
  *precisionRecallCurve;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  in_stack_fffffffffffffed8;
  unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
  *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  unsigned_long *in_stack_fffffffffffffef8;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  in_stack_ffffffffffffff00;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  in_stack_ffffffffffffff08;
  uint64_t local_e0;
  pair<unsigned_long,_unsigned_long> *local_88;
  size_type in_stack_ffffffffffffff80;
  int32_t labelId_00;
  __node_base in_stack_ffffffffffffff88;
  undefined1 local_38 [24];
  undefined1 *local_20;
  byte local_15;
  int local_14;
  
  labelId_00 = (int32_t)(in_stack_ffffffffffffff80 >> 0x20);
  local_15 = 0;
  local_14 = in_EDX;
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             0x150965);
  getPositiveCounts((Meter *)in_stack_ffffffffffffff88._M_nxt,labelId_00);
  local_20 = local_38;
  bVar2 = std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::empty((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  if (!bVar2) {
    if (local_14 == -1) {
      local_e0 = *in_RSI;
    }
    else {
      pmVar3 = std::
               unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
               ::at(in_stack_fffffffffffffee0,(key_type *)in_stack_fffffffffffffed8._M_current);
      local_e0 = pmVar3->gold;
    }
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::begin((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             *)in_stack_fffffffffffffed8._M_current);
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::end((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           *)in_stack_fffffffffffffed8._M_current);
    std::
    lower_bound<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,unsigned_long>const*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>,unsigned_long,bool(*)(std::pair<double,double>const&,double_const&)>
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (_func_bool_pair<double,_double>_ptr_double_ptr *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::end((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           *)in_stack_fffffffffffffed8._M_current);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                        *)in_stack_fffffffffffffee0,
                       (__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                        *)in_stack_fffffffffffffed8._M_current);
    if (bVar2) {
      std::
      next<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,unsigned_long>const*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>>
                (in_stack_fffffffffffffed8,0x150ad8);
    }
    local_88 = (pair<unsigned_long,_unsigned_long> *)
               std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::begin(in_stack_fffffffffffffed8._M_current);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                               *)in_stack_fffffffffffffee0,
                              (__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                               *)in_stack_fffffffffffffed8._M_current), bVar2) {
      in_stack_fffffffffffffee0 =
           (unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
            *)&local_88;
      ppVar4 = __gnu_cxx::
               __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
               ::operator->((__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                             *)in_stack_fffffffffffffee0);
      uVar1 = ppVar4->first;
      in_stack_fffffffffffffee8 = 0x43300000;
      in_stack_fffffffffffffeec = 0x45300000;
      in_stack_fffffffffffffef0 = 0;
      in_stack_fffffffffffffef4 = 0;
      auVar5._8_4_ = (int)(uVar1 >> 0x20);
      auVar5._0_8_ = uVar1;
      auVar5._12_4_ = 0x45300000;
      __gnu_cxx::
      __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
      ::operator->((__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                    *)in_stack_fffffffffffffee0);
      if (local_e0 == 0) {
        in_stack_fffffffffffffed8._M_current =
             (pair<unsigned_long,_unsigned_long> *)std::numeric_limits<double>::quiet_NaN();
      }
      else {
        auVar6._8_4_ = (int)(local_e0 >> 0x20);
        auVar6._0_8_ = local_e0;
        auVar6._12_4_ = 0x45300000;
        in_stack_fffffffffffffed8._M_current =
             (pair<unsigned_long,_unsigned_long> *)
             (((auVar5._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
             ((auVar6._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_e0) - 4503599627370496.0)));
      }
      std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
      emplace_back<double&,double&>
                ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (double *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 (double *)in_stack_fffffffffffffee0);
      __gnu_cxx::
      __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
      ::operator++((__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                   (int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
    }
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    emplace_back<double,double>
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (double *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               (double *)in_stack_fffffffffffffee0);
  }
  local_15 = 1;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  if ((local_15 & 1) == 0) {
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  }
  return in_RDI;
}

Assistant:

std::vector<std::pair<double, double>> Meter::precisionRecallCurve(
    int32_t labelId) const {
  std::vector<std::pair<double, double>> precisionRecallCurve;
  const auto& positiveCounts = getPositiveCounts(labelId);
  if (positiveCounts.empty()) {
    return precisionRecallCurve;
  }

  uint64_t golds =
      (labelId == kAllLabels) ? metrics_.gold : labelMetrics_.at(labelId).gold;

  auto fullRecall = std::lower_bound(
      positiveCounts.begin(),
      positiveCounts.end(),
      golds,
      utils::compareFirstLess);

  if (fullRecall != positiveCounts.end()) {
    fullRecall = std::next(fullRecall);
  }

  for (auto it = positiveCounts.begin(); it != fullRecall; it++) {
    double precision = 0.0;
    double truePositives = it->first;
    double falsePositives = it->second;
    if (truePositives + falsePositives != 0.0) {
      precision = truePositives / (truePositives + falsePositives);
    }
    double recall = golds != 0 ? (truePositives / double(golds))
                               : std::numeric_limits<double>::quiet_NaN();
    precisionRecallCurve.emplace_back(precision, recall);
  }
  precisionRecallCurve.emplace_back(1.0, 0.0);

  return precisionRecallCurve;
}